

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * getStringCompressionType_abi_cxx11_
                   (string *__return_storage_ptr__,CompressionType compression)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (compression == LZ4) {
    pcVar2 = "lz4";
    pcVar1 = "";
  }
  else if (compression == BZ2) {
    pcVar2 = "bz2";
    pcVar1 = "";
  }
  else if (compression == Uncompressed) {
    pcVar2 = "none";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getStringCompressionType(minibag::CompressionType compression)
{
    switch(compression)
    {
    case minibag::compression::Uncompressed: return "none";
    case minibag::compression::BZ2: return "bz2";
    case minibag::compression::LZ4: return "lz4";
    default: return "Unknown";
    }
}